

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::recursive_manipulation
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_> *fw)

{
  char cVar1;
  int iVar2;
  int iVar3;
  rt_expression_interface<double> *prVar4;
  rt_expression_interface<double> *prVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  cVar1 = (**(code **)(*(long *)*fw + 0x18))(*fw,this);
  if (cVar1 != '\0') {
    prVar4 = (rt_expression_interface<double> *)(**(code **)(*(long *)*fw + 0x10))(*fw,this);
    return prVar4;
  }
  prVar5 = (rt_expression_interface<double> *)operator_new(0x18);
  prVar4 = (this->expr_)._M_ptr;
  iVar2 = (*prVar4->_vptr_rt_expression_interface[0xc])(prVar4,fw);
  iVar3 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar5->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_00125ce0;
  prVar5[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar2);
  prVar5[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar3);
  return prVar5;
}

Assistant:

InterfaceType * recursive_manipulation(rt_manipulation_wrapper<InterfaceType> const & fw) const
      {
        if (fw.modifies(this))
          return fw(this);

        return new rt_unary_expr(expr_->recursive_manipulation(fw),
                              op_->clone() );
      }